

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O3

Statement * __thiscall slang::ast::ProceduralBlockSymbol::getBody(ProceduralBlockSymbol *this)

{
  Scope *pSVar1;
  int iVar2;
  undefined4 extraout_var;
  Statement *pSVar3;
  LookupLocation LVar4;
  StatementContext local_88;
  ASTContext local_50;
  
  pSVar3 = this->stmt;
  if (pSVar3 == (Statement *)0x0) {
    this->isConstructing = true;
    pSVar1 = (this->super_Symbol).parentScope;
    LVar4 = LookupLocation::after(&this->super_Symbol);
    local_50.lookupIndex = LVar4.index;
    local_50.flags.m_bits = 0;
    local_50.instanceOrProc = (Symbol *)0x0;
    local_50.firstTempVar = (TempVarSymbol *)0x0;
    local_50.randomizeDetails = (RandomizeDetails *)0x0;
    local_50.assertionInstance = (AssertionInstanceDetails *)0x0;
    local_50.scope.ptr = pSVar1;
    ASTContext::setProceduralBlock(&local_50,this);
    if (this->procedureKind == Final) {
      local_50.flags.m_bits = local_50.flags.m_bits | 0x1000;
    }
    local_88.lastEventControl.startLoc = (SourceLocation)0x0;
    local_88.lastEventControl.endLoc = (SourceLocation)0x0;
    local_88.flags.m_bits = 0;
    local_88.blocks._M_ptr = (this->blocks)._M_ptr;
    local_88.blocks._M_extent._M_extent_value = (this->blocks)._M_extent._M_extent_value;
    local_88.rootAstContext = &local_50;
    iVar2 = Statement::bind((int)this->stmtSyntax,(sockaddr *)&local_50,(socklen_t)&local_88);
    this->stmt = (Statement *)CONCAT44(extraout_var,iVar2);
    Statement::StatementContext::~StatementContext(&local_88);
    this->isConstructing = false;
    pSVar3 = this->stmt;
  }
  return pSVar3;
}

Assistant:

const Statement& ProceduralBlockSymbol::getBody() const {
    if (!stmt) {
        SLANG_ASSERT(!isConstructing);

        isConstructing = true;
        auto guard = ScopeGuard([this] { isConstructing = false; });

        auto scope = getParentScope();
        SLANG_ASSERT(scope && stmtSyntax);

        ASTContext context(*scope, LookupLocation::after(*this));
        context.setProceduralBlock(*this);

        if (procedureKind == ProceduralBlockKind::Final)
            context.flags |= ASTFlags::Final;

        Statement::StatementContext stmtCtx(context);
        stmtCtx.blocks = blocks;

        stmt = &Statement::bind(*stmtSyntax, context, stmtCtx);
    }
    return *stmt;
}